

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallTargetsCommand.h
# Opt level: O0

cmCommand * __thiscall cmInstallTargetsCommand::Clone(cmInstallTargetsCommand *this)

{
  cmCommand *this_00;
  cmInstallTargetsCommand *this_local;
  
  this_00 = (cmCommand *)operator_new(0x30);
  cmInstallTargetsCommand((cmInstallTargetsCommand *)this_00);
  return this_00;
}

Assistant:

cmCommand* Clone() CM_OVERRIDE { return new cmInstallTargetsCommand; }